

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_query_decoder.c
# Opt level: O0

int pt_qry_fetch_event(pt_query_decoder *decoder)

{
  int iVar1;
  int errcode;
  pt_event *ev;
  pt_query_decoder *decoder_local;
  
  if (decoder == (pt_query_decoder *)0x0) {
    decoder_local._4_4_ = -1;
  }
  else {
    iVar1 = pt_evt_next(&decoder->evdec,&decoder->event,0x48);
    if (iVar1 < 0) {
      decoder->status = iVar1;
      memset(&decoder->event,0xff,0x48);
    }
    decoder_local._4_4_ = 0;
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_qry_fetch_event(struct pt_query_decoder *decoder)
{
	struct pt_event *ev;
	int errcode;

	if (!decoder)
		return -pte_internal;

	ev = &decoder->event;

	errcode = pt_evt_next(&decoder->evdec, ev, sizeof(*ev));
	if (errcode < 0) {
		decoder->status = errcode;
		memset(ev, 0xff, sizeof(*ev));
	}

	return 0;
}